

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderBuiltinConstantTests.cpp
# Opt level: O3

string * deqp::gles31::Functional::anon_unknown_1::makeCaseName
                   (string *__return_storage_ptr__,string *varName)

{
  char c;
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  ulong uVar4;
  ostringstream name;
  char local_1b1;
  string *local_1b0;
  undefined1 local_1a8 [376];
  
  local_1b0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  local_1b1 = de::toLower((varName->_M_dataplus)._M_p[3]);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1b1,1);
  if (4 < varName->_M_string_length) {
    uVar4 = 4;
    do {
      c = (varName->_M_dataplus)._M_p[uVar4];
      bVar1 = de::isUpper(c);
      if (bVar1) {
        local_1b1 = '_';
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,&local_1b1,1);
        local_1b1 = de::toLower(c);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,&local_1b1,1);
      }
      else {
        local_1b1 = c;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1b1,1);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < varName->_M_string_length);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  psVar3 = (string *)std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar3;
}

Assistant:

static std::string makeCaseName (const std::string& varName)
{
	DE_ASSERT(varName.length() > 3);
	DE_ASSERT(varName.substr(0,3) == "gl_");

	std::ostringstream name;
	name << de::toLower(char(varName[3]));

	for (size_t ndx = 4; ndx < varName.length(); ndx++)
	{
		const char c = char(varName[ndx]);
		if (de::isUpper(c))
			name << '_' << de::toLower(c);
		else
			name << c;
	}

	return name.str();
}